

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_get.c
# Opt level: O0

void test_get_on_response(nhr_request request,nhr_response response)

{
  unsigned_short uVar1;
  uint body_len_00;
  char *body_00;
  void *test_number_00;
  unsigned_long test_number;
  uint body_len;
  char *body;
  nhr_response response_local;
  nhr_request request_local;
  
  body_00 = (char *)nhr_response_get_body(response);
  body_len_00 = nhr_response_get_body_length(response);
  test_number_00 = nhr_request_get_user_object(request);
  test_get_error = 1;
  printf("\nResponse #%lu:\n",test_number_00);
  test_get_log_body(body_00,body_len_00);
  if (test_number_00 == (void *)0x0) {
    test_get_error = 10;
  }
  else if (test_number_00 == (void *)0x4) {
    uVar1 = nhr_response_get_status_code(response);
    printf("\nGet status code: %i, need 418",(ulong)uVar1);
    uVar1 = nhr_response_get_status_code(response);
    test_get_error = 0xe;
    if (uVar1 == 0x1a2) {
      test_get_error = 0;
    }
  }
  else {
    uVar1 = nhr_response_get_status_code(response);
    if (uVar1 == 200) {
      if (test_number_00 == (void *)0x5) {
        printf("\nGet body_len: %u, need 1024",(ulong)body_len_00);
        test_get_error = 0xf;
        if (body_len_00 == 0x400) {
          test_get_error = 0;
        }
      }
      else if ((body_00 == (char *)0x0) || (body_len_00 == 0)) {
        test_get_error = 5;
      }
      else {
        test_get_error = test_get_parse_body(body_00,(unsigned_long)test_number_00);
      }
    }
    else {
      test_get_error = 0xf;
    }
  }
  test_get_working = '\0';
  return;
}

Assistant:

static void test_get_on_response(nhr_request request, nhr_response response) {
	char * body = nhr_response_get_body(response);
	unsigned int body_len = nhr_response_get_body_length(response);
	unsigned long test_number = (unsigned long)nhr_request_get_user_object(request);

	test_get_error = 1;
	printf("\nResponse #%lu:\n", test_number);
	test_get_log_body(body, body_len);
	if (test_number == 0) {
		test_get_error = 10;
		test_get_working = nhr_false;
		return;
	}

	if (test_number == 4) { // status code 418
		printf("\nGet status code: %i, need 418", (int)nhr_response_get_status_code(response));
		test_get_error = nhr_response_get_status_code(response) == 418 ? 0 : 14;
		test_get_working = nhr_false;
		return;
	}

	if (nhr_response_get_status_code(response) != 200) {
		test_get_error = 15;
		test_get_working = nhr_false;
		return;
	}

	if (test_number == 5) {
		printf("\nGet body_len: %u, need 1024", body_len);
		test_get_error = body_len == 1024 ? 0 : 15;
		test_get_working = nhr_false;
		return;
	}

	if (body && body_len) {
		test_get_error = test_get_parse_body(body, test_number);
	} else {
		test_get_error = 5;
	}

	test_get_working = nhr_false;
}